

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

void Abc_NtkVerifyReportError(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int *pModel)

{
  int iVar1;
  int iVar2;
  int *__ptr;
  int *__ptr_00;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  int local_50;
  int local_4c;
  int iNode;
  int i;
  int nPrinted;
  int nErrors;
  int *pValues2;
  int *pValues1;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  int *pModel_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  local_50 = -1;
  vNodes = (Vec_Ptr_t *)pModel;
  pModel_local = (int *)pNtk2;
  pNtk2_local = pNtk1;
  iVar1 = Abc_NtkCiNum(pNtk1);
  iVar2 = Abc_NtkCiNum((Abc_Ntk_t *)pModel_local);
  if (iVar1 != iVar2) {
    __assert_fail("Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcVerify.c"
                  ,0x2e7,"void Abc_NtkVerifyReportError(Abc_Ntk_t *, Abc_Ntk_t *, int *)");
  }
  iVar1 = Abc_NtkCoNum(pNtk2_local);
  iVar2 = Abc_NtkCoNum((Abc_Ntk_t *)pModel_local);
  if (iVar1 != iVar2) {
    __assert_fail("Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcVerify.c"
                  ,0x2e8,"void Abc_NtkVerifyReportError(Abc_Ntk_t *, Abc_Ntk_t *, int *)");
  }
  __ptr = Abc_NtkVerifySimulatePattern(pNtk2_local,&vNodes->nCap);
  __ptr_00 = Abc_NtkVerifySimulatePattern((Abc_Ntk_t *)pModel_local,&vNodes->nCap);
  i = 0;
  for (local_4c = 0; iVar1 = Abc_NtkCoNum(pNtk2_local), local_4c < iVar1; local_4c = local_4c + 1) {
    i = (uint)(__ptr[local_4c] != __ptr_00[local_4c]) + i;
  }
  printf("Verification failed for at least %d outputs: ",(ulong)(uint)i);
  iNode = 0;
  for (local_4c = 0; iVar1 = Abc_NtkCoNum(pNtk2_local), local_4c < iVar1; local_4c = local_4c + 1) {
    if (__ptr[local_4c] != __ptr_00[local_4c]) {
      if (local_50 == -1) {
        local_50 = local_4c;
      }
      pAVar3 = Abc_NtkCo(pNtk2_local,local_4c);
      pcVar4 = Abc_ObjName(pAVar3);
      printf(" %s",pcVar4);
      iNode = iNode + 1;
      if (iNode == 3) break;
    }
  }
  if (iNode != i) {
    printf(" ...");
  }
  printf("\n");
  if (-1 < local_50) {
    pAVar3 = Abc_NtkCo(pNtk2_local,local_50);
    pcVar4 = Abc_ObjName(pAVar3);
    printf("Output %s: Value in Network1 = %d. Value in Network2 = %d.\n",pcVar4,
           (ulong)(uint)__ptr[local_50],(ulong)(uint)__ptr_00[local_50]);
    printf("Input pattern: ");
    pValues1 = (int *)Abc_NtkCo(pNtk2_local,local_50);
    pNode = (Abc_Obj_t *)Abc_NtkNodeSupport(pNtk2_local,(Abc_Obj_t **)&pValues1,1);
    for (local_4c = 0; iVar1 = Abc_NtkCiNum(pNtk2_local), local_4c < iVar1; local_4c = local_4c + 1)
    {
      pValues1 = (int *)Abc_NtkCi(pNtk2_local,local_4c);
      ((Abc_Obj_t *)pValues1)->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)local_4c;
    }
    pValues1 = (int *)Vec_PtrEntry((Vec_Ptr_t *)pNode,0);
    iVar1 = Abc_ObjIsCi((Abc_Obj_t *)pValues1);
    if (iVar1 != 0) {
      for (local_4c = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNode), local_4c < iVar1;
          local_4c = local_4c + 1) {
        pValues1 = (int *)Vec_PtrEntry((Vec_Ptr_t *)pNode,local_4c);
        iVar1 = Abc_ObjIsCi((Abc_Obj_t *)pValues1);
        if (iVar1 == 0) {
          __assert_fail("Abc_ObjIsCi(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcVerify.c"
                        ,0x311,"void Abc_NtkVerifyReportError(Abc_Ntk_t *, Abc_Ntk_t *, int *)");
        }
        pcVar4 = Abc_ObjName((Abc_Obj_t *)pValues1);
        printf(" %s=%d",pcVar4,(ulong)(uint)(&vNodes->nCap)[(int)*(undefined8 *)(pValues1 + 0x10)]);
      }
    }
    printf("\n");
    Vec_PtrFree((Vec_Ptr_t *)pNode);
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  return;
}

Assistant:

void Abc_NtkVerifyReportError( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int * pModel, Vec_Int_t * mismatch )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;    
    int nErrors, nPrinted, i, iNode = -1;

    assert( Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2) );
    assert( Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2) );
    // get the CO values under this model
    pValues1__ = Abc_NtkVerifySimulatePattern( pNtk1, pModel );
    pValues2__ = Abc_NtkVerifySimulatePattern( pNtk2, pModel );
    // count the mismatches
    nErrors = 0;
    for ( i = 0; i < Abc_NtkCoNum(pNtk1); i++ )
        nErrors += (int)( pValues1__[i] != pValues2__[i] );
    //printf( "Verification failed for at least %d outputs: ", nErrors );
    // print the first 3 outputs
    nPrinted = 0;
    for ( i = 0; i < Abc_NtkCoNum(pNtk1); i++ )
        if ( pValues1__[i] != pValues2__[i] )
        {
            if ( iNode == -1 )
                iNode = i;
            //printf( " %s", Abc_ObjName(Abc_NtkCo(pNtk1,i)) );
            if ( ++nPrinted == 3 )
                break;
        }
    /*if ( nPrinted != nErrors )
        printf( " ..." );
    printf( "\n" );*/
    // report mismatch for the first output
    if ( iNode >= 0 )
    {
        /*printf( "Output %s: Value in Network1 = %d. Value in Network2 = %d.\n", 
            Abc_ObjName(Abc_NtkCo(pNtk1,iNode)), pValues1[iNode], pValues2[iNode] );
        printf( "Input pattern: " );*/
        // collect PIs in the cone
        pNode = Abc_NtkCo(pNtk1,iNode);
        vNodes = Abc_NtkNodeSupport( pNtk1, &pNode, 1 );
        // set the PI numbers
        Abc_NtkForEachCi( pNtk1, pNode, i )
            pNode->iTemp = i;
        // print the model
        pNode = (Abc_Obj_t *)Vec_PtrEntry( vNodes, 0 );
        if ( Abc_ObjIsCi(pNode) )
        {
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
            {
                assert( Abc_ObjIsCi(pNode) );
                //printf( " %s=%d", Abc_ObjName(pNode), pModel[(int)pNode->pCopy] );
				Vec_IntPush(mismatch, Abc_ObjId(pNode)-1);
				Vec_IntPush(mismatch, pModel[(int)(size_t)pNode->pCopy]);
            }
        }
        //printf( "\n" );
        Vec_PtrFree( vNodes );
    }
    free( pValues1__ );
    free( pValues2__ );
}